

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptIdentifier(HlslGrammar *this,HlslToken *idToken)

{
  bool bVar1;
  EHlslTokenClass tokenClass;
  char *s;
  TString *pTVar2;
  char *idString;
  HlslToken *idToken_local;
  HlslGrammar *this_local;
  
  bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIdentifier);
  if (bVar1) {
    memcpy(idToken,&(this->super_HlslTokenStream).token,0x28);
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    this_local._7_1_ = true;
  }
  else {
    bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokThis);
    if (bVar1) {
      memcpy(idToken,&(this->super_HlslTokenStream).token,0x28);
      HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
      idToken->tokenClass = EHTokIdentifier;
      pTVar2 = NewPoolTString_abi_cxx11_(this->intermediate->implicitThisName);
      (idToken->field_2).string = pTVar2;
      this_local._7_1_ = true;
    }
    else {
      tokenClass = HlslTokenStream::peek(&this->super_HlslTokenStream);
      s = getTypeString(this,tokenClass);
      if (s == (char *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        pTVar2 = NewPoolTString_abi_cxx11_(s);
        (this->super_HlslTokenStream).token.field_2.string = pTVar2;
        (this->super_HlslTokenStream).token.tokenClass = EHTokIdentifier;
        memcpy(idToken,&(this->super_HlslTokenStream).token,0x28);
        this->typeIdentifiers = true;
        HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptIdentifier(HlslToken& idToken)
{
    // IDENTIFIER
    if (peekTokenClass(EHTokIdentifier)) {
        idToken = token;
        advanceToken();
        return true;
    }

    // THIS
    // -> maps to the IDENTIFIER spelled with the internal special name for 'this'
    if (peekTokenClass(EHTokThis)) {
        idToken = token;
        advanceToken();
        idToken.tokenClass = EHTokIdentifier;
        idToken.string = NewPoolTString(intermediate.implicitThisName);
        return true;
    }

    // type that can be used as IDENTIFIER

    // Even though "sample", "bool", "float", etc keywords (for types, interpolation modifiers),
    // they ARE still accepted as identifiers.  This is not a dense space: e.g, "void" is not a
    // valid identifier, nor is "linear".  This code special cases the known instances of this, so
    // e.g, "int sample;" or "float float;" is accepted.  Other cases can be added here if needed.

    const char* idString = getTypeString(peek());
    if (idString == nullptr)
        return false;

    token.string     = NewPoolTString(idString);
    token.tokenClass = EHTokIdentifier;
    idToken = token;
    typeIdentifiers = true;

    advanceToken();

    return true;
}